

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O2

long __thiscall gl4cts::AdvancedManyDrawCalls2::Run(AdvancedManyDrawCalls2 *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  bool bVar1;
  GLuint GVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar3;
  void *pvVar4;
  ulong uVar5;
  GLuint i;
  ulong uVar6;
  int iVar7;
  long lVar8;
  allocator_type local_81;
  GLuint data;
  undefined4 uStack_7c;
  pointer local_78;
  value_type_conflict4 local_64;
  char *glsl_fs;
  char *glsl_vs;
  string local_50;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_contextInfo,"GL_ARB_shader_storage_buffer_object");
  if (bVar1) {
    glsl_vs = 
    "#version 420 core\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  gl_Position = vec4(0, 0, 0, 1);\n}"
    ;
    glsl_fs = 
    "#version 420 core\n#extension GL_ARB_shader_storage_buffer_object : require\nlayout(binding = 0) uniform atomic_uint g_counter;\nlayout(std430, binding = 0) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  uint c = atomicCounterIncrement(g_counter);\n  g_output[c] = c;\n}"
    ;
    this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
    this->m_vsp = GVar2;
    GVar2 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&glsl_fs);
    this->m_fsp = GVar2;
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckProgram
                      (&this->super_SACSubcaseBase,this->m_vsp);
    lVar8 = -1;
    if (bVar1) {
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckProgram
                        (&this->super_SACSubcaseBase,this->m_fsp);
      if (bVar1) {
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,1,this->m_vsp);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_ppo,2,this->m_fsp);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_acbo);
        data = 0;
        glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,&data,0x88ea);
        local_64 = 0xffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&data,1000,&local_64,
                   &local_81);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_ssbo);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,(long)local_78 - (long)CONCAT44(uStack_7c,data),
                   (void *)CONCAT44(uStack_7c,data),0x88e9);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&data);
        glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
        glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_ppo);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
        iVar7 = 100;
        while (bVar1 = iVar7 != 0, iVar7 = iVar7 + -1, bVar1) {
          glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
        }
        iVar7 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        width = *(GLsizei *)CONCAT44(extraout_var,iVar7);
        iVar7 = (*((this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.m_context)->
                  m_renderCtx->_vptr_RenderContext[4])();
        lVar8 = 0;
        glu::CallLogWrapper::glViewport
                  (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_00,iVar7) + 4));
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->m_acbo);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        piVar3 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,4,1);
        if (*piVar3 != 100) {
          gl4cts::anon_unknown_0::Output("AC buffer content is %u, sholud be 100.\n");
          lVar8 = -1;
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_ssbo);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,400,1);
        std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar4,(long)pvVar4 + 400);
        for (uVar6 = 0; uVar6 != 100; uVar6 = uVar6 + 1) {
          uVar5 = (ulong)*(uint *)((long)pvVar4 + uVar6 * 4);
          if (uVar6 != uVar5) {
            gl4cts::anon_unknown_0::Output
                      ("data[%u] is %u, should be %u.\n",uVar6 & 0xffffffff,uVar5,uVar6 & 0xffffffff
                      );
            lVar8 = -1;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      }
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GL_ARB_shader_storage_buffer_object not supported",
               (allocator<char> *)&data);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar8 = 0;
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{

		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_storage_buffer_object"))
		{
			OutputNotSupported("GL_ARB_shader_storage_buffer_object not supported");
			return NO_ERROR;
		}

		const char* const glsl_vs = "#version 420 core" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
									"void main() {" NL "  gl_Position = vec4(0, 0, 0, 1);" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "#extension GL_ARB_shader_storage_buffer_object : require" NL
			"layout(binding = 0) uniform atomic_uint g_counter;" NL "layout(std430, binding = 0) buffer Output {" NL
			"  uint g_output[];" NL "};" NL "void main() {" NL "  uint c = atomicCounterIncrement(g_counter);" NL
			"  g_output[c] = c;" NL "}";

		m_vsp = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_fsp = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		if (!CheckProgram(m_vsp) || !CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_ppo, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_ppo, GL_FRAGMENT_SHADER_BIT, m_fsp);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_acbo);
		{
			GLuint data = 0;
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, &data, GL_DYNAMIC_COPY);
		}

		{
			std::vector<GLuint> data(1000, 0xffff);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_ssbo);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * 4), &data[0], GL_DYNAMIC_READ);
		}

		// draw
		glViewport(0, 0, 1, 1);
		glBindProgramPipeline(m_ppo);
		glBindVertexArray(m_vao);
		for (int i = 0; i < 100; ++i)
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		glViewport(0, 0, getWindowWidth(), getWindowHeight());

		long status = NO_ERROR;

		{
			GLuint* data;

			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 4, GL_MAP_READ_BIT));
			if (data[0] != 100)
			{
				status = ERROR;
				Output("AC buffer content is %u, sholud be 100.\n", data[0]);
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
			glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
			glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
			data = static_cast<GLuint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 100 * 4, GL_MAP_READ_BIT));
			std::sort(data, data + 100);
			for (GLuint i = 0; i < 100; ++i)
			{
				if (data[i] != i)
				{
					status = ERROR;
					Output("data[%u] is %u, should be %u.\n", i, data[i], i);
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}

		return status;
	}